

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,variable_statement *s)

{
  pointer pdVar1;
  wostream *pwVar2;
  size_t i;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  std::operator<<(this->os_,"var");
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    pdVar1 = (s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(s->l_).
                       super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) / 0x28) <= uVar3)
    break;
    pcVar4 = ", ";
    if (uVar3 == 0) {
      pcVar4 = " ";
    }
    pwVar2 = std::operator<<(this->os_,pcVar4);
    std::operator<<(pwVar2,(wstring *)((long)&(pdVar1->id_)._M_dataplus._M_p + lVar5));
    if (*(long *)((long)&(pdVar1->init_)._M_t.
                         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                 + lVar5) != 0) {
      std::operator<<(this->os_," = ");
      accept<mjs::print_visitor>
                (*(expression **)
                  ((long)&(pdVar1->init_)._M_t.
                          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                  + lVar5),this);
    }
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x28;
  }
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const variable_statement& s) {
        os_ << "var";
        for (size_t i = 0; i < s.l().size(); ++i) {
            const auto& d = s.l()[i];
            os_ << (i ? ", ": " ") << d.id();
            if (d.init()) {
                os_ << " = ";
                accept(*d.init(), *this);
            }
        }
        os_ << ';';
    }